

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_str_insert_str_utf8(nk_str *str,int pos,char *text)

{
  int len;
  int iVar1;
  nk_rune unicode;
  nk_rune local_2c;
  
  if (text != (char *)0x0 && str != (nk_str *)0x0) {
    len = nk_utf_decode(text,&local_2c,4);
    if (len != 0 && local_2c != 0) {
      do {
        iVar1 = nk_utf_decode(text + len,&local_2c,4);
        len = len + iVar1;
        if (local_2c == 0) break;
      } while (iVar1 != 0);
    }
    nk_str_insert_at_rune(str,pos,text,len);
  }
  return 0;
}

Assistant:

NK_API int
nk_str_insert_str_utf8(struct nk_str *str, int pos, const char *text)
{
    int runes = 0;
    int byte_len = 0;
    int num_runes = 0;
    int glyph_len = 0;
    nk_rune unicode;
    if (!str || !text) return 0;

    glyph_len = byte_len = nk_utf_decode(text+byte_len, &unicode, 4);
    while (unicode != '\0' && glyph_len) {
        glyph_len = nk_utf_decode(text+byte_len, &unicode, 4);
        byte_len += glyph_len;
        num_runes++;
    }
    nk_str_insert_at_rune(str, pos, text, byte_len);
    return runes;
}